

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O1

Symbol * __thiscall slang::ast::ASTContext::getContainingSymbol(ASTContext *this)

{
  SubroutineSymbol *pSVar1;
  SubroutineSymbol *pSVar2;
  
  pSVar1 = (SubroutineSymbol *)this->instanceOrProc;
  pSVar2 = (SubroutineSymbol *)0x0;
  if ((pSVar1 != (SubroutineSymbol *)0x0) && ((pSVar1->super_Symbol).kind == ProceduralBlock)) {
    pSVar2 = pSVar1;
  }
  if (pSVar2 == (SubroutineSymbol *)0x0) {
    pSVar2 = getContainingSubroutine(this);
  }
  if (pSVar2 == (SubroutineSymbol *)0x0) {
    pSVar2 = (SubroutineSymbol *)((this->scope).ptr)->thisSym;
  }
  return &pSVar2->super_Symbol;
}

Assistant:

const Symbol& ASTContext::getContainingSymbol() const {
    const Symbol* containingSym = getProceduralBlock();
    if (!containingSym)
        containingSym = getContainingSubroutine();

    if (!containingSym)
        containingSym = &scope->asSymbol();

    return *containingSym;
}